

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_macro_once(sexp ctx,sexp x,sexp op,int depth)

{
  undefined8 uVar1;
  long in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp res;
  sexp_conflict in_stack_00000220;
  sexp_conflict in_stack_00000228;
  sexp_conflict in_stack_00000230;
  sexp in_stack_ffffffffffffffb8;
  sexp head;
  sexp_sint_t n;
  sexp psVar2;
  undefined8 in_stack_ffffffffffffffd8;
  
  psVar2 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  head = (sexp)&stack0xffffffffffffffd0;
  n = *(sexp_sint_t *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc0;
  psVar2 = sexp_cons_op((sexp)in_stack_ffffffffffffffd8,psVar2,n,head,in_stack_ffffffffffffffb8);
  psVar2 = sexp_cons_op((sexp)in_stack_ffffffffffffffd8,psVar2,n,head,in_stack_ffffffffffffffb8);
  uVar1 = sexp_cons_op((sexp)in_stack_ffffffffffffffd8,psVar2,n,head,in_stack_ffffffffffffffb8);
  psVar2 = (sexp)uVar1;
  if (((uVar1 & 3) != 0) || (((sexp)uVar1)->tag != 0x13)) {
    uVar1 = sexp_make_child_context(head,in_stack_ffffffffffffffb8);
  }
  if ((((uVar1 & 3) != 0) || (((sexp)uVar1)->tag != 0x13)) &&
     (((*(ulong *)(*(long *)(in_RDI + 0x50) + 0x40) & 3) != 0 ||
      (**(int **)(*(long *)(in_RDI + 0x50) + 0x40) != 0x13)))) {
    uVar1 = sexp_apply(in_stack_00000230,in_stack_00000228,in_stack_00000220);
  }
  if (((((psVar2->value).stack.length & 3) == 0) && (((psVar2->value).type.name)->tag == 6)) &&
     ((((psVar2->value).type.name)->value).type.slots != (sexp)0x0)) {
    if (((uVar1 & 3) == 0) && (((sexp)uVar1)->tag == 6)) {
      (((sexp)uVar1)->value).type.slots = (((psVar2->value).type.name)->value).type.slots;
    }
    else if (((uVar1 & 3) == 0) &&
            ((((sexp)uVar1)->tag == 0x13 && (*(long *)(in_RSI + 0x28) == 0x3e)))) {
      (((sexp)uVar1)->value).type.setters = (((psVar2->value).type.name)->value).type.slots;
    }
  }
  *(sexp_sint_t *)(in_RDI + 0x6080) = n;
  return (sexp)uVar1;
}

Assistant:

static sexp analyze_macro_once (sexp ctx, sexp x, sexp op, int depth) {
  sexp res;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  tmp = sexp_cons(ctx, sexp_macro_env(op), SEXP_NULL);
  tmp = sexp_cons(ctx, sexp_context_env(ctx), tmp);
  tmp = sexp_cons(ctx, x, tmp);
  res = sexp_exceptionp(tmp) ? tmp : sexp_make_child_context(ctx, sexp_context_lambda(ctx));
  if (!sexp_exceptionp(res) && !sexp_exceptionp(sexp_context_exception(ctx)))
    res = sexp_apply(res, sexp_macro_proc(op), tmp);
  if (sexp_pairp(sexp_car(tmp)) && sexp_pair_source(sexp_car(tmp))) {
    if (sexp_pairp(res))
      sexp_pair_source(res) = sexp_pair_source(sexp_car(tmp));
    else if (sexp_exceptionp(res) && sexp_not(sexp_exception_source(x)))
      sexp_exception_source(res) = sexp_pair_source(sexp_car(tmp));
  }
  sexp_gc_release1(ctx);
  return res;
}